

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearboxAngled.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsGearboxAngled::ConstraintsLoadJacobians(ChShaftsGearboxAngled *this)

{
  ChConstraintThreeGeneric *this_00;
  double dVar1;
  double dVar2;
  ChRowVectorRef local_58;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  dVar1 = this->t0;
  this_00 = &this->constraint;
  ChConstraintThreeGeneric::Get_Cq_a(&local_58,this_00);
  if (0 < local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_cols.m_value) {
    *local_58.
     super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
     super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
     .
     super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
     .m_data = dVar1;
    ChConstraintThreeGeneric::Get_Cq_b(&local_58,this_00);
    if (0 < local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_cols.m_value) {
      *local_58.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
       .m_data = -1.0;
      local_28 = this->t0;
      local_30 = (this->shaft_dir1).m_data[2];
      dVar2 = local_28 * (this->shaft_dir1).m_data[0];
      local_20 = local_28 * (this->shaft_dir1).m_data[1] - (this->shaft_dir2).m_data[1];
      dVar1 = (this->shaft_dir2).m_data[0];
      local_38 = (this->shaft_dir2).m_data[2];
      ChConstraintThreeGeneric::Get_Cq_c(&local_58,this_00);
      if (0 < local_58.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_cols.m_value) {
        *local_58.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
         .m_data = 0.0;
        ChConstraintThreeGeneric::Get_Cq_c(&local_58,this_00);
        if (1 < local_58.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_cols.m_value) {
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_data[1] = 0.0;
          ChConstraintThreeGeneric::Get_Cq_c(&local_58,this_00);
          if (2 < local_58.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_cols.m_value) {
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_data[2] = 0.0;
            ChConstraintThreeGeneric::Get_Cq_c(&local_58,this_00);
            if (3 < local_58.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                    .m_cols.m_value) {
              local_58.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data[3] = dVar2 - dVar1;
              ChConstraintThreeGeneric::Get_Cq_c(&local_58,this_00);
              if (4 < local_58.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                      .m_cols.m_value) {
                local_58.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_data[4] = local_20;
                ChConstraintThreeGeneric::Get_Cq_c(&local_58,this_00);
                if (5 < local_58.
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                        .
                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                        .
                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                        .m_cols.m_value) {
                  local_58.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data[5] = local_30 * local_28 - local_38;
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, Level = 1]"
               );
}

Assistant:

void ChShaftsGearboxAngled::ConstraintsLoadJacobians() {
    // compute jacobians
    constraint.Get_Cq_a()(0) = t0;
    constraint.Get_Cq_b()(0) = -1.0;

    // ChVector<> jacw = body->TransformDirectionParentToLocal(t0*shaft_dir1 - shaft_dir2);
    ChVector<> jacw = (t0 * shaft_dir1 - shaft_dir2);

    constraint.Get_Cq_c()(0) = 0;
    constraint.Get_Cq_c()(1) = 0;
    constraint.Get_Cq_c()(2) = 0;
    constraint.Get_Cq_c()(3) = jacw.x();
    constraint.Get_Cq_c()(4) = jacw.y();
    constraint.Get_Cq_c()(5) = jacw.z();
}